

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  CostCacheInterval *cur;
  ushort *dist_array;
  CostModel *pCVar6;
  CostManager *manager;
  VP8LHistogram *h;
  long lVar7;
  CostCacheInterval *pCVar8;
  int64_t *cost;
  ushort *puVar9;
  long lVar10;
  long lVar11;
  uint dist;
  ulong uVar12;
  uint uVar13;
  int64_t iVar14;
  uint64_t nmemb;
  uint len;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint64_t nmemb_00;
  ushort *puVar18;
  bool bVar19;
  long local_b8;
  int local_b0;
  int extra_bits;
  int code;
  ulong local_98;
  ushort *local_90;
  CostModel *local_88;
  uint32_t *local_80;
  int local_74;
  VP8LColorCache hashers;
  long local_48;
  
  uVar17 = ysize * xsize;
  nmemb = (uint64_t)(int)uVar17;
  local_80 = argb;
  local_74 = xsize;
  dist_array = (ushort *)WebPSafeMalloc(nmemb,2);
  if (dist_array == (ushort *)0x0) {
    uVar17 = 0;
    goto LAB_0013df39;
  }
  iVar4 = (1 << ((byte)cache_bits & 0x1f)) + 0x118;
  if (cache_bits < 1) {
    iVar4 = 0x118;
  }
  nmemb_00 = 1;
  pCVar6 = (CostModel *)WebPSafeCalloc(1,(long)iVar4 * 4 + 0xca8);
  manager = (CostManager *)WebPSafeCalloc(1,0x81c8);
  bVar19 = false;
  if (manager != (CostManager *)0x0 && pCVar6 != (CostModel *)0x0) {
    pCVar6->literal = pCVar6[1].alpha;
    if (0 < cache_bits) {
      iVar4 = VP8LColorCacheInit(&hashers,cache_bits);
      bVar19 = false;
      if (iVar4 == 0) goto LAB_0013dd93;
    }
    local_88 = pCVar6;
    h = VP8LAllocateHistogram(cache_bits);
    if (h == (VP8LHistogram *)0x0) {
      bVar19 = false;
      VP8LFreeHistogram((VP8LHistogram *)0x0);
    }
    else {
      VP8LHistogramInit(h,cache_bits,1);
      VP8LHistogramStoreRefs(refs_src,VP8LDistanceToPlaneCode,local_74,h);
      pCVar6 = local_88;
      iVar4 = (1 << ((byte)h->palette_code_bits & 0x1f)) + 0x118;
      if (h->palette_code_bits < 1) {
        iVar4 = 0x118;
      }
      ConvertPopulationCountTableToBitEstimates(iVar4,h->literal,local_88->literal);
      ConvertPopulationCountTableToBitEstimates(0x100,h->red,pCVar6->red);
      ConvertPopulationCountTableToBitEstimates(0x100,h->blue,pCVar6->blue);
      ConvertPopulationCountTableToBitEstimates(0x100,h->alpha,pCVar6->alpha);
      ConvertPopulationCountTableToBitEstimates(0x28,h->distance,pCVar6->distance);
      VP8LFreeHistogram(h);
      uVar13 = 0xfff;
      if ((int)uVar17 < 0xfff) {
        uVar13 = uVar17;
      }
      manager->costs = (int64_t *)0x0;
      manager->cache_intervals = (CostCacheInterval *)0x0;
      manager->head = (CostInterval *)0x0;
      manager->recycled_intervals = (CostInterval *)0x0;
      manager->count = 0;
      manager->dist_array = dist_array;
      local_90 = dist_array;
      CostManagerInitFreeList(manager);
      uVar12 = 0;
      uVar15 = 0;
      if (0 < (int)uVar13) {
        uVar15 = (ulong)uVar13;
      }
      for (; dist_array = local_90, uVar15 != uVar12; uVar12 = uVar12 + 1) {
        VP8LPrefixEncodeBits((int)uVar12,&code,&extra_bits);
        manager->cost_cache[uVar12] =
             (long)extra_bits * 0x800000 + (ulong)local_88->literal[(long)code + 0x100];
      }
      manager->cache_intervals_size = 1;
      for (lVar7 = 5; lVar7 + -4 < (long)(int)uVar13; lVar7 = lVar7 + 1) {
        if (manager->cost_cache[lVar7 + -4] != manager->cost_cache[lVar7 + -5]) {
          nmemb_00 = nmemb_00 + 1;
          manager->cache_intervals_size = nmemb_00;
        }
      }
      pCVar8 = (CostCacheInterval *)WebPSafeMalloc(nmemb_00,0x10);
      manager->cache_intervals = pCVar8;
      if (pCVar8 != (CostCacheInterval *)0x0) {
        pCVar8->start = 0;
        pCVar8->end = 1;
        iVar14 = manager->cost_cache[0];
        pCVar8->cost = iVar14;
        for (lVar7 = 5; lVar7 + -4 < (long)(int)uVar13; lVar7 = lVar7 + 1) {
          lVar11 = manager->cost_cache[lVar7 + -4];
          if (lVar11 != iVar14) {
            pCVar8[1].start = (int)lVar7 + -4;
            pCVar8[1].cost = lVar11;
            pCVar8 = pCVar8 + 1;
          }
          pCVar8->end = (int)lVar7 + -3;
          iVar14 = lVar11;
        }
        cost = (int64_t *)WebPSafeMalloc(nmemb,8);
        manager->costs = cost;
        if (cost != (int64_t *)0x0) {
          uVar15 = 0;
          uVar12 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar12 = uVar15;
          }
          for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            cost[uVar15] = 0x7fffffffffffffff;
          }
          *dist_array = 0;
          local_b8 = 0;
          AddSingleLiteralWithCostModel
                    (local_80,&hashers,local_88,0,(uint)(0 < cache_bits),0,cost,dist_array);
          local_48 = -1;
          local_b0 = -1;
          local_98 = 0;
          uVar17 = 0xffffffff;
          uVar13 = 0xffffffff;
          for (lVar7 = 1; lVar7 < (long)nmemb; lVar7 = lVar7 + 1) {
            lVar11 = manager->costs[lVar7 + -1];
            dist = hash_chain->offset_length[lVar7] >> 0xc;
            len = hash_chain->offset_length[lVar7] & 0xfff;
            iVar4 = (int)lVar7;
            AddSingleLiteralWithCostModel
                      (local_80,&hashers,local_88,iVar4,(uint)(0 < cache_bits),lVar11,manager->costs
                       ,local_90);
            if (1 < len) {
              if (dist == uVar13) {
                uVar12 = local_98 & 0xffffffff;
                if (local_b0 != 0) {
                  uVar12 = (ulong)(uVar17 + iVar4 + -2);
                }
                if ((int)uVar12 < (int)(iVar4 + len + -1)) {
                  uVar17 = 0;
                  lVar11 = local_b8;
                  do {
                    lVar10 = lVar11;
                    lVar11 = lVar10 + 1;
                    if ((int)uVar12 < lVar11) goto LAB_0013dc6b;
                    uVar2 = hash_chain->offset_length[lVar10 + 2];
                    uVar17 = uVar2 & 0xfff;
                  } while (uVar2 >> 0xc == uVar13);
                  uVar17 = hash_chain->offset_length[lVar11] & 0xfff;
LAB_0013dc6b:
                  iVar5 = (int)lVar10;
                  local_98 = CONCAT44(local_98._4_4_,iVar5 + 1);
                  local_b0 = 0;
                  UpdateCostAtIndex(manager,iVar5,0);
                  UpdateCostAtIndex(manager,(int)local_98,0);
                  PushInterval(manager,manager->costs[iVar5] + local_48,(int)local_98,uVar17);
                  local_98 = (ulong)(iVar5 + uVar17);
                }
                else {
                  local_b0 = 0;
                  local_98 = uVar12;
                }
              }
              else {
                iVar5 = VP8LDistanceToPlaneCode(local_74,dist);
                VP8LPrefixEncodeBits(iVar5,&code,&extra_bits);
                local_48 = (long)extra_bits * 0x800000 + (ulong)pCVar6->distance[code];
                PushInterval(manager,lVar11 + local_48,iVar4,len);
                local_b0 = 1;
              }
            }
            UpdateCostAtIndex(manager,iVar4,1);
            local_b8 = local_b8 + 1;
            uVar17 = len;
            uVar13 = dist;
          }
          bVar19 = refs_src->error == 0;
          dist_array = local_90;
          goto LAB_0013dd7d;
        }
      }
      CostManagerClear(manager);
      bVar19 = false;
    }
LAB_0013dd7d:
    pCVar6 = local_88;
    if (0 < cache_bits) {
      VP8LColorCacheClear(&hashers);
      pCVar6 = local_88;
    }
  }
LAB_0013dd93:
  CostManagerClear(manager);
  WebPSafeFree(pCVar6);
  WebPSafeFree(manager);
  uVar17 = 0;
  if (bVar19) {
    puVar18 = dist_array + nmemb;
    for (puVar9 = dist_array + (nmemb - 1); dist_array <= puVar9;
        puVar9 = (ushort *)((long)puVar9 - (ulong)((uint)uVar1 * 2))) {
      uVar1 = *puVar9;
      puVar18[-1] = uVar1;
      puVar18 = puVar18 + -1;
    }
    if ((cache_bits < 1) || (iVar4 = VP8LColorCacheInit(&hashers,cache_bits), iVar4 != 0)) {
      uVar15 = (ulong)((long)(dist_array + nmemb) - (long)puVar18) >> 1;
      local_90 = dist_array;
      VP8LClearBackwardRefs(refs_dst);
      uVar16 = 0;
      uVar12 = uVar15 & 0xffffffff;
      if ((int)uVar15 < 1) {
        uVar12 = uVar16;
      }
      uVar17 = 0;
      for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
        uVar1 = puVar18[uVar16];
        if (uVar1 == 1) {
          if (cache_bits < 1) {
LAB_0013de73:
            uVar13 = local_80[uVar17];
            uVar15 = 0x10000;
          }
          else {
            uVar3 = local_80[uVar17];
            uVar13 = uVar3 * 0x1e35a7bd >> ((byte)hashers.hash_shift & 0x1f);
            if (((int)uVar13 < 0) || (uVar15 = 0x10001, hashers.colors[(int)uVar13] != uVar3)) {
              hashers.colors[(int)uVar13] = uVar3;
              goto LAB_0013de73;
            }
          }
          VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)uVar13 << 0x20 | uVar15));
        }
        else {
          VP8LBackwardRefsCursorAdd
                    (refs_dst,(PixOrCopy)
                              ((ulong)CONCAT42(hash_chain->offset_length[uVar17] >> 0xc,uVar1) *
                               0x10000 + 2));
          if (0 < cache_bits) {
            for (uVar15 = 0; (uint)uVar1 != uVar15; uVar15 = uVar15 + 1) {
              hashers.colors
              [(int)(local_80[uVar17 + uVar15] * 0x1e35a7bd >> ((byte)hashers.hash_shift & 0x1f))] =
                   local_80[uVar17 + uVar15];
            }
          }
        }
        uVar17 = uVar17 + uVar1;
      }
      bVar19 = refs_dst->error == 0;
      dist_array = local_90;
      if (0 < cache_bits) {
        VP8LColorCacheClear(&hashers);
        dist_array = local_90;
      }
    }
    else {
      bVar19 = false;
    }
    uVar17 = (uint)bVar19;
  }
LAB_0013df39:
  WebPSafeFree(dist_array);
  return uVar17;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}